

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.cpp
# Opt level: O3

void __thiscall MetaSim::Event::action(Event *this)

{
  _Elt_pointer puVar1;
  _Elt_pointer puVar2;
  _Map_pointer ppuVar3;
  
  (this->_lastTime).v = (this->_time).v;
  this->_priority = this->_std_priority;
  (*this->_vptr_Event[2])();
  puVar2 = (this->_particles).
           super__Deque_base<std::unique_ptr<MetaSim::ParticleInterface,_std::default_delete<MetaSim::ParticleInterface>_>,_std::allocator<std::unique_ptr<MetaSim::ParticleInterface,_std::default_delete<MetaSim::ParticleInterface>_>_>_>
           ._M_impl.super__Deque_impl_data._M_start._M_cur;
  if (puVar2 != (this->_particles).
                super__Deque_base<std::unique_ptr<MetaSim::ParticleInterface,_std::default_delete<MetaSim::ParticleInterface>_>,_std::allocator<std::unique_ptr<MetaSim::ParticleInterface,_std::default_delete<MetaSim::ParticleInterface>_>_>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_cur) {
    puVar1 = (this->_particles).
             super__Deque_base<std::unique_ptr<MetaSim::ParticleInterface,_std::default_delete<MetaSim::ParticleInterface>_>,_std::allocator<std::unique_ptr<MetaSim::ParticleInterface,_std::default_delete<MetaSim::ParticleInterface>_>_>_>
             ._M_impl.super__Deque_impl_data._M_start._M_last;
    ppuVar3 = (this->_particles).
              super__Deque_base<std::unique_ptr<MetaSim::ParticleInterface,_std::default_delete<MetaSim::ParticleInterface>_>,_std::allocator<std::unique_ptr<MetaSim::ParticleInterface,_std::default_delete<MetaSim::ParticleInterface>_>_>_>
              ._M_impl.super__Deque_impl_data._M_start._M_node;
    do {
      (*((puVar2->_M_t).
         super___uniq_ptr_impl<MetaSim::ParticleInterface,_std::default_delete<MetaSim::ParticleInterface>_>
         ._M_t.
         super__Tuple_impl<0UL,_MetaSim::ParticleInterface_*,_std::default_delete<MetaSim::ParticleInterface>_>
         .super__Head_base<0UL,_MetaSim::ParticleInterface_*,_false>._M_head_impl)->
        _vptr_ParticleInterface[2])();
      puVar2 = puVar2 + 1;
      if (puVar2 == puVar1) {
        puVar2 = ppuVar3[1];
        ppuVar3 = ppuVar3 + 1;
        puVar1 = puVar2 + 0x40;
      }
    } while (puVar2 != (this->_particles).
                       super__Deque_base<std::unique_ptr<MetaSim::ParticleInterface,_std::default_delete<MetaSim::ParticleInterface>_>,_std::allocator<std::unique_ptr<MetaSim::ParticleInterface,_std::default_delete<MetaSim::ParticleInterface>_>_>_>
                       ._M_impl.super__Deque_impl_data._M_finish._M_cur);
  }
  return;
}

Assistant:

void Event::action()
    {
        DBGENTER(_EVENT_DBG_LEV);

        /* Handles the event ONLY if it has target!!! Otherwise executes
         * its tracing and calls the related stats.....
         */
        _lastTime = _time; 

        // restore old priority
        restorePriority();

        // the doit(), probe() and record() could raise
        // arbitrary exception...  hence, I can't specify the
        // exception type in the interface!
        // It may repost the event
        doit();

        // for(its = _stats.begin(); its != _stats.end(); its++)
        //     (*its)->probe(this);

        // the new way of doing statistics. The old way
        // remains valid, but it is deprecated.
        DBGPRINT_2("Calling the particle probes, size = ", 
                   _particles.size());
        for (auto itp = _particles.begin(); itp != _particles.end(); itp++) {
            DBGPRINT("Calling probe");
            (*itp)->probe();
        } 
    }